

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool std::operator<(pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                    *__x,pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         *__y)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = (__x->first).m_val;
  uVar2 = (__y->first).m_val;
  bVar3 = true;
  if (uVar2 <= uVar1) {
    if (uVar1 <= uVar2) {
      return (__x->second).m_val < (__y->second).m_val;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

constexpr operator UnderlyingType() const { return m_val; }